

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlagsy.c
# Opt level: O3

int zlagsy_slu(int *n,int *k,double *d,doublecomplex *a,int *lda,int *iseed,doublecomplex *work,
              int *info)

{
  long lVar1;
  doublecomplex dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  uint *puVar11;
  uint *puVar12;
  int *lda_00;
  long lVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  double dVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  long lVar24;
  double *pdVar25;
  int iVar26;
  ulong uVar27;
  uint uVar28;
  ulong uVar29;
  double *pdVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  ulong uVar35;
  int iVar36;
  int iVar37;
  ulong unaff_R15;
  doublecomplex *pdVar38;
  bool bVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  uint local_108;
  int local_104;
  uint *local_100;
  uint local_f4;
  undefined8 local_f0;
  int local_e4;
  doublecomplex *local_e0;
  doublecomplex local_d8;
  doublecomplex *local_c0;
  undefined1 local_b8 [16];
  ulong local_a0;
  uint *local_98;
  int *local_90;
  double local_88;
  undefined8 uStack_80;
  double *local_78;
  ulong local_70;
  int *local_68;
  doublecomplex *local_60;
  doublecomplex local_58;
  long local_48;
  doublecomplex *local_40;
  doublecomplex *local_38;
  
  iVar14 = *lda;
  local_a0 = (ulong)iVar14;
  *info = 0;
  uVar31 = *n;
  local_100 = (uint *)n;
  local_90 = lda;
  local_68 = iseed;
  if ((int)uVar31 < 0) {
    local_104 = 1;
    iVar14 = -1;
  }
  else if ((uint)*k < uVar31) {
    if ((int)uVar31 <= *lda) {
      uVar27 = ~local_a0;
      local_48 = uVar27 * 0x10;
      local_e0 = a + uVar27;
      iVar18 = iVar14 + 2;
      uVar22 = 2;
      iVar26 = -1;
      uVar29 = uVar27 & 0xffffffff;
      uVar34 = 1;
      do {
        local_108 = *n;
        uVar35 = (ulong)local_108;
        if ((int)uVar34 < (int)local_108) {
          uVar33 = uVar22;
          if ((int)uVar22 < (int)local_108) {
            uVar33 = local_108;
          }
          iVar36 = 0;
          do {
            local_e0[iVar18 + iVar36].r = 0.0;
            local_e0[iVar18 + iVar36].i = 0.0;
            iVar36 = iVar36 + 1;
          } while (uVar33 + iVar26 != iVar36);
          unaff_R15 = (ulong)(uint)(iVar36 - (int)uVar29);
        }
        uVar22 = uVar22 + 1;
        iVar26 = iVar26 + -1;
        local_f0._0_4_ = (int)uVar27;
        uVar29 = (ulong)(uint)((int)uVar29 + (int)local_f0);
        iVar18 = iVar18 + iVar14 + 1;
        bVar39 = uVar34 != uVar31;
        uVar34 = uVar34 + 1;
      } while (bVar39);
      uVar31 = *n;
      if (0 < (int)uVar31) {
        uVar35 = 0;
        unaff_R15 = 0;
        do {
          uVar34 = (int)uVar35 + iVar14 + 1;
          uVar35 = (ulong)uVar34;
          local_e0[(int)uVar34].r = d[unaff_R15];
          local_e0[(int)uVar34].i = 0.0;
          unaff_R15 = unaff_R15 + 1;
        } while (uVar31 != unaff_R15);
      }
      local_f4 = (uint)unaff_R15;
      zlagsy_slu::i = *n;
      local_98 = (uint *)k;
      local_40 = a;
      if (1 < zlagsy_slu::i) {
        local_38 = work + 1;
        local_f0 = CONCAT44((int)(uVar27 >> 0x20),iVar14 + 1);
        local_60 = work;
        local_c0 = (doublecomplex *)(local_a0 * 0x10 + 0x10);
        local_78 = &work->i;
        do {
          puVar11 = local_100;
          zlagsy_slu::i = zlagsy_slu::i + -1;
          local_104 = (*local_100 - zlagsy_slu::i) + 1;
          zlarnv_slu(&c__3,local_68,&local_104,work);
          local_104 = (*puVar11 - zlagsy_slu::i) + 1;
          zlagsy_slu::wn = dznrm2_(&local_104,work,&c__1);
          local_b8._8_4_ = extraout_XMM0_Dc;
          local_b8._0_8_ = zlagsy_slu::wn;
          local_b8._12_4_ = extraout_XMM0_Dd;
          dVar20 = z_abs(work);
          local_d8.r = ((double)local_b8._0_8_ / dVar20) * work->r;
          local_d8.i = ((double)local_b8._0_8_ / dVar20) * work->i;
          zlagsy_slu::wa.i = local_d8.i;
          zlagsy_slu::wa.r = local_d8.r;
          uVar40 = 0;
          uVar41 = 0;
          if ((zlagsy_slu::wn != 0.0) || (NAN(zlagsy_slu::wn))) {
            local_d8.r = local_d8.r + work->r;
            local_d8.i = local_d8.i + work->i;
            zlagsy_slu::wb.i = local_d8.i;
            zlagsy_slu::wb.r = local_d8.r;
            local_104 = *local_100 - zlagsy_slu::i;
            z_div(&local_d8,&c_b2,&zlagsy_slu::wb);
            zscal_(&local_104,&local_d8,local_38,&c__1);
            work->r = 1.0;
            work->i = 0.0;
            z_div(&local_d8,&zlagsy_slu::wb,&zlagsy_slu::wa);
            uVar40 = SUB84(local_d8.r,0);
            uVar41 = (undefined4)((ulong)local_d8.r >> 0x20);
          }
          puVar11 = local_100;
          zlagsy_slu::tau.r = (double)CONCAT44(uVar41,uVar40);
          zlagsy_slu::tau.i = 0.0;
          local_104 = (*local_100 - zlagsy_slu::i) + 1;
          zlacgv_slu(&local_104,work,&c__1);
          local_104 = (*puVar11 - zlagsy_slu::i) + 1;
          zsymv_("Lower",&local_104,&zlagsy_slu::tau,local_e0 + zlagsy_slu::i * (int)local_f0,
                 local_90,work,&c__1,&c_b1,work + (int)*puVar11,&c__1);
          local_104 = (*puVar11 - zlagsy_slu::i) + 1;
          zlacgv_slu(&local_104,work,&c__1);
          local_b8._8_8_ = 0;
          local_b8._0_8_ = zlagsy_slu::tau.r * -0.5 + zlagsy_slu::tau.i * -0.0;
          local_88 = zlagsy_slu::tau.i * -0.5 + zlagsy_slu::tau.r * 0.0;
          uStack_80 = 0;
          local_104 = (*puVar11 - zlagsy_slu::i) + 1;
          zdotc_(&local_58,&local_104,work,&c__1,work + (int)*puVar11,&c__1);
          local_d8.r = (double)local_b8._0_8_ * local_58.r + local_58.i * -local_88;
          local_d8.i = (double)local_b8._0_8_ * local_58.i + local_58.r * local_88;
          zlagsy_slu::alpha.i = local_d8.i;
          zlagsy_slu::alpha.r = local_d8.r;
          local_104 = (*puVar11 - zlagsy_slu::i) + 1;
          zaxpy_(&local_104,&zlagsy_slu::alpha,work,&c__1,work + (int)*puVar11,&c__1);
          uVar31 = *puVar11;
          uVar27 = (ulong)uVar31;
          lVar23 = (long)zlagsy_slu::i;
          if (zlagsy_slu::i <= (int)uVar31) {
            lVar16 = (long)(int)uVar31;
            uVar34 = uVar31 - zlagsy_slu::i;
            local_88 = (double)(ulong)uVar34;
            local_e4 = uVar31 + 1;
            lVar19 = lVar23 + -1;
            uVar22 = (int)local_f0 * zlagsy_slu::i - 1;
            pdVar30 = (double *)((long)&local_e0->r + (long)local_c0 * lVar23);
            local_b8._0_8_ = lVar23;
            lVar15 = lVar23;
            pdVar25 = local_78;
            do {
              lVar21 = 0;
              unaff_R15 = (ulong)uVar22;
              lVar24 = lVar19;
              uVar33 = uVar31;
              do {
                dVar20 = *(double *)((long)pdVar25 + lVar21 + -8);
                dVar4 = local_60[lVar15 - lVar23].r;
                dVar7 = local_60[lVar15 - lVar23].i;
                dVar3 = work[(int)uVar33].r * dVar4 + dVar7 * -work[(int)uVar33].i;
                dVar4 = work[(int)uVar33].r * dVar7 + dVar4 * work[(int)uVar33].i;
                dVar5 = local_60[(int)(uVar34 + (int)lVar15)].r;
                dVar8 = local_60[(int)(uVar34 + (int)lVar15)].i;
                dVar7 = (*(double *)((long)pdVar30 + lVar21) -
                        (dVar20 * dVar5 + dVar8 * -*(double *)((long)pdVar25 + lVar21))) - dVar3;
                dVar20 = (((double *)((long)pdVar30 + lVar21))[1] -
                         (dVar20 * dVar8 + dVar5 * *(double *)((long)pdVar25 + lVar21))) - dVar4;
                uVar40 = SUB84(dVar20,0);
                uVar41 = (undefined4)((ulong)dVar20 >> 0x20);
                auVar6._8_4_ = uVar40;
                auVar6._0_8_ = dVar7;
                auVar6._12_4_ = uVar41;
                *(undefined1 (*) [16])((long)pdVar30 + lVar21) = auVar6;
                lVar24 = lVar24 + 1;
                unaff_R15 = (ulong)((int)unaff_R15 + 1);
                lVar21 = lVar21 + 0x10;
                uVar33 = uVar33 + 1;
              } while (lVar24 < lVar16);
              lVar15 = lVar15 + 1;
              lVar19 = lVar19 + 1;
              uVar22 = uVar22 + (int)local_f0;
              pdVar30 = (double *)((long)pdVar30 + (long)local_c0);
              pdVar25 = pdVar25 + 2;
              uVar31 = uVar31 + 1;
            } while (local_e4 != (int)lVar15);
            local_58.i._0_4_ = SUB84(dVar4,0);
            local_58.r = dVar3;
            local_58.i._4_4_ = (int)((ulong)dVar4 >> 0x20);
            local_d8.i._0_4_ = uVar40;
            local_d8.r = dVar7;
            local_d8.i._4_4_ = uVar41;
            uVar35 = uVar27;
            local_70 = uVar27;
          }
          local_108 = (uint)uVar35;
          local_f4 = (uint)unaff_R15;
        } while (1 < zlagsy_slu::i);
      }
      local_104 = ~*local_98 + *local_100;
      zlagsy_slu::i = 1;
      if (0 < local_104) {
        local_e4 = (int)local_a0 + 1;
        local_c0 = work;
        local_f0 = local_a0 * 0x10 + 0x10;
        local_70 = (long)&local_40->i + local_48;
        local_78 = (double *)CONCAT44(local_78._4_4_,(int)local_a0 + 1);
        pdVar38 = local_e0;
        do {
          puVar11 = local_98;
          local_108 = (*local_100 - (*local_98 + zlagsy_slu::i)) + 1;
          iVar18 = (int)local_a0;
          zlagsy_slu::wn =
               dznrm2_((integer *)&local_108,
                       pdVar38 + (int)(zlagsy_slu::i * iVar18 + *local_98 + zlagsy_slu::i),&c__1);
          local_b8._8_4_ = extraout_XMM0_Dc_00;
          local_b8._0_8_ = zlagsy_slu::wn;
          local_b8._12_4_ = extraout_XMM0_Dd_00;
          dVar20 = z_abs(pdVar38 + (int)(zlagsy_slu::i * iVar18 + *puVar11 + zlagsy_slu::i));
          uVar31 = *puVar11;
          iVar14 = zlagsy_slu::i + uVar31;
          lVar23 = (long)(zlagsy_slu::i * iVar18 + iVar14);
          dVar3 = ((double)local_b8._0_8_ / dVar20) * pdVar38[lVar23].r;
          dVar20 = ((double)local_b8._0_8_ / dVar20) * pdVar38[lVar23].i;
          uVar40 = (undefined4)((ulong)dVar20 >> 0x20);
          local_d8.i._0_4_ = SUB84(dVar20,0);
          local_d8.r = dVar3;
          local_d8.i._4_4_ = uVar40;
          zlagsy_slu::wa.i._0_4_ = SUB84(dVar20,0);
          zlagsy_slu::wa.r = dVar3;
          zlagsy_slu::wa.i._4_4_ = uVar40;
          if ((zlagsy_slu::wn != 0.0) || (NAN(zlagsy_slu::wn))) {
            dVar3 = dVar3 + pdVar38[lVar23].r;
            dVar20 = dVar20 + pdVar38[lVar23].i;
            uVar40 = SUB84(dVar20,0);
            uVar41 = (undefined4)((ulong)dVar20 >> 0x20);
            local_d8.i._0_4_ = uVar40;
            local_d8.r = dVar3;
            local_d8.i._4_4_ = uVar41;
            zlagsy_slu::wb.i._0_4_ = uVar40;
            zlagsy_slu::wb.r = dVar3;
            zlagsy_slu::wb.i._4_4_ = uVar41;
            local_108 = *local_100 - iVar14;
            z_div(&local_d8,&c_b2,&zlagsy_slu::wb);
            zscal_((integer *)&local_108,&local_d8,
                   pdVar38 + (int)(zlagsy_slu::i + *puVar11 + zlagsy_slu::i * iVar18 + 1),&c__1);
            local_108 = iVar18 * zlagsy_slu::i + *puVar11 + zlagsy_slu::i;
            pdVar38[(int)local_108].r = 1.0;
            pdVar38[(int)local_108].i = 0.0;
            z_div(&local_d8,&zlagsy_slu::wb,&zlagsy_slu::wa);
            uVar40 = local_d8.r._0_4_;
            uVar41 = local_d8.r._4_4_;
            uVar31 = *puVar11;
            iVar14 = zlagsy_slu::i + uVar31;
            lVar23 = (long)(zlagsy_slu::i * iVar18 + iVar14);
          }
          else {
            uVar40 = 0;
            uVar41 = 0;
          }
          lda_00 = local_90;
          zlagsy_slu::tau.r = (double)CONCAT44(uVar41,uVar40);
          zlagsy_slu::tau.i = 0.0;
          local_108 = (*local_100 - iVar14) + 1;
          local_f4 = uVar31 - 1;
          zgemv_("Conjugate transpose",(integer *)&local_108,(integer *)&local_f4,&c_b2,
                 pdVar38 + ((zlagsy_slu::i + 1) * iVar18 + iVar14),local_90,pdVar38 + lVar23,&c__1,
                 &c_b1,work,&c__1);
          iVar14 = zlagsy_slu::i + *local_98;
          local_108 = (*local_100 - iVar14) + 1;
          local_f4 = *local_98 - 1;
          local_d8.r = -zlagsy_slu::tau.r;
          local_d8.i._0_4_ = SUB84(zlagsy_slu::tau.i,0);
          local_d8.i._4_4_ = (uint)((ulong)zlagsy_slu::tau.i >> 0x20) ^ 0x80000000;
          zgerc_((integer *)&local_108,(integer *)&local_f4,&local_d8,
                 pdVar38 + (zlagsy_slu::i * iVar18 + iVar14),&c__1,work,&c__1,
                 pdVar38 + ((zlagsy_slu::i + 1) * iVar18 + iVar14),lda_00);
          puVar12 = local_98;
          local_108 = (*local_100 - (*local_98 + zlagsy_slu::i)) + 1;
          zlacgv_slu((int *)&local_108,
                     pdVar38 + (int)(zlagsy_slu::i * iVar18 + *local_98 + zlagsy_slu::i),&c__1);
          puVar11 = local_100;
          iVar14 = *puVar12 + zlagsy_slu::i;
          local_108 = (*local_100 - iVar14) + 1;
          zsymv_("Lower",(int *)&local_108,&zlagsy_slu::tau,pdVar38 + iVar14 * local_e4,local_90,
                 pdVar38 + (zlagsy_slu::i * iVar18 + iVar14),&c__1,&c_b1,work,&c__1);
          puVar12 = local_98;
          local_108 = (*puVar11 - (*local_98 + zlagsy_slu::i)) + 1;
          zlacgv_slu((int *)&local_108,
                     pdVar38 + (int)(zlagsy_slu::i * iVar18 + *local_98 + zlagsy_slu::i),&c__1);
          local_b8._8_8_ = 0;
          local_b8._0_8_ = zlagsy_slu::tau.r * -0.5 + zlagsy_slu::tau.i * -0.0;
          local_88 = zlagsy_slu::tau.i * -0.5 + zlagsy_slu::tau.r * 0.0;
          uStack_80 = 0;
          local_108 = (*puVar11 - (*puVar12 + zlagsy_slu::i)) + 1;
          zdotc_(&local_58,(integer *)&local_108,
                 pdVar38 + (int)(zlagsy_slu::i * iVar18 + *puVar12 + zlagsy_slu::i),&c__1,work,&c__1
                );
          local_d8.r = (double)local_b8._0_8_ * local_58.r + local_58.i * -local_88;
          local_d8.i = (double)local_b8._0_8_ * local_58.i + local_58.r * local_88;
          zlagsy_slu::alpha.i = local_d8.i;
          zlagsy_slu::alpha.r = local_d8.r;
          local_108 = (*puVar11 - (*puVar12 + zlagsy_slu::i)) + 1;
          zaxpy_((integer *)&local_108,&zlagsy_slu::alpha,
                 pdVar38 + (int)(zlagsy_slu::i * iVar18 + *puVar12 + zlagsy_slu::i),&c__1,work,&c__1
                );
          auVar6 = local_b8;
          iVar14 = zlagsy_slu::i;
          local_108 = *puVar11;
          lVar23 = (long)(int)local_108;
          uVar31 = *puVar12;
          local_b8._4_4_ = 0;
          local_b8._0_4_ = uVar31;
          dVar20 = (double)(ulong)(uint)zlagsy_slu::i;
          local_b8._8_8_ = auVar6._8_8_;
          iVar26 = zlagsy_slu::i + uVar31;
          iVar18 = zlagsy_slu::i * iVar18;
          if (iVar26 <= (int)local_108) {
            lVar24 = (long)iVar26;
            local_68 = (int *)CONCAT44(local_68._4_4_,iVar18);
            pdVar25 = (double *)((long)&pdVar38->r + local_f0 * lVar24);
            lVar16 = lVar24 * 0x10 + local_70 + (long)iVar18 * 0x10;
            lVar15 = 0;
            lVar19 = lVar24;
            do {
              lVar13 = 0;
              lVar21 = lVar15;
              do {
                dVar3 = *(double *)(lVar16 + -8 + lVar13);
                dVar4 = *(double *)(lVar16 + lVar13);
                dVar5 = pdVar38[iVar18 + lVar19].r;
                dVar8 = pdVar38[iVar18 + lVar19].i;
                dVar7 = work[(int)lVar21].r * dVar5 + dVar8 * -work[(int)lVar21].i;
                dVar5 = work[(int)lVar21].r * dVar8 + dVar5 * work[(int)lVar21].i;
                dVar8 = local_c0[(int)lVar19 - iVar26].r;
                dVar9 = local_c0[(int)lVar19 - iVar26].i;
                dVar10 = ((double *)((long)pdVar25 + lVar13))[1];
                *(double *)((long)pdVar25 + lVar13) =
                     (*(double *)((long)pdVar25 + lVar13) - (dVar3 * dVar8 + dVar9 * -dVar4)) -
                     dVar7;
                ((double *)((long)pdVar25 + lVar13))[1] =
                     (dVar10 - (dVar3 * dVar9 + dVar8 * dVar4)) - dVar5;
                lVar13 = lVar13 + 0x10;
                lVar1 = lVar24 + lVar21;
                lVar21 = lVar21 + 1;
              } while (lVar1 < lVar23);
              lVar19 = lVar19 + 1;
              pdVar25 = (double *)((long)pdVar25 + local_f0);
              lVar16 = lVar16 + 0x10;
              lVar15 = lVar15 + 1;
            } while (local_108 + 1 != (int)lVar19);
            local_58.i._0_4_ = SUB84(dVar5,0);
            local_58.r = dVar7;
            local_58.i._4_4_ = (int)((ulong)dVar5 >> 0x20);
            pdVar38 = local_e0;
            local_f4 = local_108;
            local_88 = dVar20;
            local_60 = (doublecomplex *)(ulong)local_108;
          }
          uVar34 = zlagsy_slu::wa.i._4_4_ ^ 0x80000000;
          local_d8.i._0_4_ = zlagsy_slu::wa.i._0_4_;
          local_d8.r = -zlagsy_slu::wa.r;
          local_d8.i._4_4_ = uVar34;
          dVar2.i._0_4_ = zlagsy_slu::wa.i._0_4_;
          dVar2.r = -zlagsy_slu::wa.r;
          dVar2.i._4_4_ = uVar34;
          pdVar38[iVar18 + iVar26] = dVar2;
          if (iVar26 < (int)local_108) {
            memset(pdVar38 + (int)(local_e4 * iVar14 + uVar31 + 1),0,
                   (ulong)((local_108 + ~uVar31) - iVar14) * 0x10 + 0x10);
            lVar19 = (long)iVar26;
            local_f4 = (int)local_78 * iVar14 + uVar31;
            do {
              lVar19 = lVar19 + 1;
              local_f4 = local_f4 + 1;
            } while (lVar19 < lVar23);
          }
          zlagsy_slu::i = iVar14 + 1;
        } while (iVar14 < local_104);
      }
      uVar31 = *local_100;
      if ((int)uVar31 < 1) {
        return 0;
      }
      uVar34 = *local_100;
      iVar14 = (int)local_a0;
      iVar18 = iVar14 + 2;
      iVar26 = iVar14 * 2 + 1;
      uVar33 = 2;
      uVar22 = 1;
      do {
        uVar28 = uVar22 + 1;
        uVar17 = uVar33;
        if ((int)uVar33 < (int)uVar34) {
          uVar17 = uVar34;
        }
        zlagsy_slu::i = uVar28;
        if ((int)uVar22 < (int)uVar34) {
          uVar32 = uVar28;
          if ((int)uVar28 < (int)uVar34) {
            uVar32 = uVar34;
          }
          zlagsy_slu::i = uVar32 + 1;
          iVar36 = iVar26;
          iVar37 = iVar18;
          do {
            dVar20 = local_e0[iVar37].i;
            local_e0[iVar36].r = local_e0[iVar37].r;
            local_e0[iVar36].i = dVar20;
            uVar17 = uVar17 - 1;
            iVar37 = iVar37 + 1;
            iVar36 = iVar36 + iVar14;
          } while (uVar22 != uVar17);
        }
        uVar33 = uVar33 + 1;
        iVar18 = iVar18 + iVar14 + 1;
        iVar26 = iVar26 + iVar14 + 1;
        bVar39 = uVar22 != uVar31;
        uVar22 = uVar28;
      } while (bVar39);
      return 0;
    }
    local_104 = 5;
    iVar14 = -5;
  }
  else {
    local_104 = 2;
    iVar14 = -2;
  }
  *info = iVar14;
  input_error("ZLAGSY",&local_104);
  return 0;
}

Assistant:

int zlagsy_slu(int *n, int *k, double *d,
	doublecomplex *a, int *lda, int *iseed, doublecomplex *work,
	int *info)
{
    /* System generated locals */
    int a_dim1, a_offset, i__1, i__2, i__3, i__4, i__5, i__6, i__7, i__8,
	    i__9;
    double d__1;
    doublecomplex z__1, z__2, z__3, z__4;

    /* Local variables */
    static int i, j;
    static doublecomplex alpha;
    extern /* Subroutine */ int zgerc_(int *, int *, doublecomplex *,
	    doublecomplex *, int *, doublecomplex *, int *,
	    doublecomplex *, int *), zscal_(int *, doublecomplex *,
	    doublecomplex *, int *);
    extern /* Double Complex */ void zdotc_(doublecomplex *, int *,
	    doublecomplex *, int *, doublecomplex *, int *);
    extern /* Subroutine */ int	zsymv_(char *, int *,
	    doublecomplex *, doublecomplex *, int *, doublecomplex *,
	    int *, doublecomplex *, doublecomplex *, int *);
    extern double dznrm2_(int *, doublecomplex *, int *);
    static int ii, jj;
    static doublecomplex wa, wb;
    static double wn;
    extern /* Subroutine */ int zlacgv_slu(int *, doublecomplex *, int *), zlarnv_slu(int *,
	    int *, int *, doublecomplex *);
    extern int input_error(char *, int *);
    static doublecomplex tau;


/*  -- LAPACK auxiliary test routine (version 2.0) --   
       Univ. of Tennessee, Univ. of California Berkeley, NAG Ltd.,   
       Courant Institute, Argonne National Lab, and Rice University   
       September 30, 1994   


    Purpose   
    =======   

    ZLAGSY generates a complex symmetric matrix A, by pre- and post-   
    multiplying a real diagonal matrix D with a random unitary matrix:   
    A = U*D*U**T. The semi-bandwidth may then be reduced to k by   
    additional unitary transformations.   

    Arguments   
    =========   

    N       (input) INTEGER   
            The order of the matrix A.  N >= 0.   

    K       (input) INTEGER   
            The number of nonzero subdiagonals within the band of A.   
            0 <= K <= N-1.   

    D       (input) DOUBLE PRECISION array, dimension (N)   
            The diagonal elements of the diagonal matrix D.   

    A       (output) COMPLEX*16 array, dimension (LDA,N)   
            The generated n by n symmetric matrix A (the full matrix is   
            stored).   

    LDA     (input) INTEGER   
            The leading dimension of the array A.  LDA >= N.   

    ISEED   (input/output) INTEGER array, dimension (4)   
            On entry, the seed of the random number generator; the array 
  
            elements must be between 0 and 4095, and ISEED(4) must be   
            odd.   
            On exit, the seed is updated.   

    WORK    (workspace) COMPLEX*16 array, dimension (2*N)   

    INFO    (output) INTEGER   
            = 0: successful exit   
            < 0: if INFO = -i, the i-th argument had an illegal value   

    ===================================================================== 
  


       Test the input arguments   

       Parameter adjustments */
    --d;
    a_dim1 = *lda;
    a_offset = a_dim1 + 1;
    a -= a_offset;
    --iseed;
    --work;

    /* Function Body */
    *info = 0;
    if (*n < 0) {
	*info = -1;
    } else if (*k < 0 || *k > *n - 1) {
	*info = -2;
    } else if (*lda < SUPERLU_MAX(1,*n)) {
	*info = -5;
    }
    if (*info < 0) {
	i__1 = -(*info);
	input_error("ZLAGSY", &i__1);
	return 0;
    }

/*     initialize lower triangle of A to diagonal matrix */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	i__2 = *n;
	for (i = j + 1; i <= i__2; ++i) {
	    i__3 = i + j * a_dim1;
	    a[i__3].r = 0., a[i__3].i = 0.;
/* L10: */
	}
/* L20: */
    }
    i__1 = *n;
    for (i = 1; i <= i__1; ++i) {
	i__2 = i + i * a_dim1;
	i__3 = i;
	a[i__2].r = d[i__3], a[i__2].i = 0.;
/* L30: */
    }

/*     Generate lower triangle of symmetric matrix */

    for (i = *n - 1; i >= 1; --i) {

/*        generate random reflection */

	i__1 = *n - i + 1;
	zlarnv_slu(&c__3, &iseed[1], &i__1, &work[1]);
	i__1 = *n - i + 1;
	wn = dznrm2_(&i__1, &work[1], &c__1);
	d__1 = wn / z_abs(&work[1]);
	z__1.r = d__1 * work[1].r, z__1.i = d__1 * work[1].i;
	wa.r = z__1.r, wa.i = z__1.i;
	if (wn == 0.) {
	    tau.r = 0., tau.i = 0.;
	} else {
	    z__1.r = work[1].r + wa.r, z__1.i = work[1].i + wa.i;
	    wb.r = z__1.r, wb.i = z__1.i;
	    i__1 = *n - i;
	    z_div(&z__1, &c_b2, &wb);
	    zscal_(&i__1, &z__1, &work[2], &c__1);
	    work[1].r = 1., work[1].i = 0.;
	    z_div(&z__1, &wb, &wa);
	    d__1 = z__1.r;
	    tau.r = d__1, tau.i = 0.;
	}

/*        apply random reflection to A(i:n,i:n) from the left   
          and the right   

          compute  y := tau * A * conjg(u) */

	i__1 = *n - i + 1;
	zlacgv_slu(&i__1, &work[1], &c__1);
	i__1 = *n - i + 1;
	zsymv_("Lower", &i__1, &tau, &a[i + i * a_dim1], lda, &work[1], &c__1,
		 &c_b1, &work[*n + 1], &c__1);
	i__1 = *n - i + 1;
	zlacgv_slu(&i__1, &work[1], &c__1);

/*        compute  v := y - 1/2 * tau * ( u, y ) * u */

	z__3.r = -.5, z__3.i = 0.;
	z__2.r = z__3.r * tau.r - z__3.i * tau.i, z__2.i = z__3.r * tau.i + 
		z__3.i * tau.r;
	i__1 = *n - i + 1;
	zdotc_(&z__4, &i__1, &work[1], &c__1, &work[*n + 1], &c__1);
	z__1.r = z__2.r * z__4.r - z__2.i * z__4.i, z__1.i = z__2.r * z__4.i 
		+ z__2.i * z__4.r;
	alpha.r = z__1.r, alpha.i = z__1.i;
	i__1 = *n - i + 1;
	zaxpy_(&i__1, &alpha, &work[1], &c__1, &work[*n + 1], &c__1);

/*        apply the transformation as a rank-2 update to A(i:n,i:n)   

          CALL ZSYR2( 'Lower', N-I+1, -ONE, WORK, 1, WORK( N+1 ), 1, 
  
          $               A( I, I ), LDA ) */

	i__1 = *n;
	for (jj = i; jj <= i__1; ++jj) {
	    i__2 = *n;
	    for (ii = jj; ii <= i__2; ++ii) {
		i__3 = ii + jj * a_dim1;
		i__4 = ii + jj * a_dim1;
		i__5 = ii - i + 1;
		i__6 = *n + jj - i + 1;
		z__3.r = work[i__5].r * work[i__6].r - work[i__5].i * work[
			i__6].i, z__3.i = work[i__5].r * work[i__6].i + work[
			i__5].i * work[i__6].r;
		z__2.r = a[i__4].r - z__3.r, z__2.i = a[i__4].i - z__3.i;
		i__7 = *n + ii - i + 1;
		i__8 = jj - i + 1;
		z__4.r = work[i__7].r * work[i__8].r - work[i__7].i * work[
			i__8].i, z__4.i = work[i__7].r * work[i__8].i + work[
			i__7].i * work[i__8].r;
		z__1.r = z__2.r - z__4.r, z__1.i = z__2.i - z__4.i;
		a[i__3].r = z__1.r, a[i__3].i = z__1.i;
/* L40: */
	    }
/* L50: */
	}
/* L60: */
    }

/*     Reduce number of subdiagonals to K */

    i__1 = *n - 1 - *k;
    for (i = 1; i <= i__1; ++i) {

/*        generate reflection to annihilate A(k+i+1:n,i) */

	i__2 = *n - *k - i + 1;
	wn = dznrm2_(&i__2, &a[*k + i + i * a_dim1], &c__1);
	d__1 = wn / z_abs(&a[*k + i + i * a_dim1]);
	i__2 = *k + i + i * a_dim1;
	z__1.r = d__1 * a[i__2].r, z__1.i = d__1 * a[i__2].i;
	wa.r = z__1.r, wa.i = z__1.i;
	if (wn == 0.) {
	    tau.r = 0., tau.i = 0.;
	} else {
	    i__2 = *k + i + i * a_dim1;
	    z__1.r = a[i__2].r + wa.r, z__1.i = a[i__2].i + wa.i;
	    wb.r = z__1.r, wb.i = z__1.i;
	    i__2 = *n - *k - i;
	    z_div(&z__1, &c_b2, &wb);
	    zscal_(&i__2, &z__1, &a[*k + i + 1 + i * a_dim1], &c__1);
	    i__2 = *k + i + i * a_dim1;
	    a[i__2].r = 1., a[i__2].i = 0.;
	    z_div(&z__1, &wb, &wa);
	    d__1 = z__1.r;
	    tau.r = d__1, tau.i = 0.;
	}

/*        apply reflection to A(k+i:n,i+1:k+i-1) from the left */

	i__2 = *n - *k - i + 1;
	i__3 = *k - 1;
	zgemv_("Conjugate transpose", &i__2, &i__3, &c_b2, &a[*k + i + (i + 1)
		 * a_dim1], lda, &a[*k + i + i * a_dim1], &c__1, &c_b1, &work[
		1], &c__1);
	i__2 = *n - *k - i + 1;
	i__3 = *k - 1;
	z__1.r = -tau.r, z__1.i = -tau.i;
	zgerc_(&i__2, &i__3, &z__1, &a[*k + i + i * a_dim1], &c__1, &work[1], 
		&c__1, &a[*k + i + (i + 1) * a_dim1], lda);

/*        apply reflection to A(k+i:n,k+i:n) from the left and the rig
ht   

          compute  y := tau * A * conjg(u) */

	i__2 = *n - *k - i + 1;
	zlacgv_slu(&i__2, &a[*k + i + i * a_dim1], &c__1);
	i__2 = *n - *k - i + 1;
	zsymv_("Lower", &i__2, &tau, &a[*k + i + (*k + i) * a_dim1], lda, &a[*
		k + i + i * a_dim1], &c__1, &c_b1, &work[1], &c__1);
	i__2 = *n - *k - i + 1;
	zlacgv_slu(&i__2, &a[*k + i + i * a_dim1], &c__1);

/*        compute  v := y - 1/2 * tau * ( u, y ) * u */

	z__3.r = -.5, z__3.i = 0.;
	z__2.r = z__3.r * tau.r - z__3.i * tau.i, z__2.i = z__3.r * tau.i + 
		z__3.i * tau.r;
	i__2 = *n - *k - i + 1;
	zdotc_(&z__4, &i__2, &a[*k + i + i * a_dim1], &c__1, &work[1], &c__1);
	z__1.r = z__2.r * z__4.r - z__2.i * z__4.i, z__1.i = z__2.r * z__4.i 
		+ z__2.i * z__4.r;
	alpha.r = z__1.r, alpha.i = z__1.i;
	i__2 = *n - *k - i + 1;
	zaxpy_(&i__2, &alpha, &a[*k + i + i * a_dim1], &c__1, &work[1], &c__1)
		;

/*        apply symmetric rank-2 update to A(k+i:n,k+i:n)   

          CALL ZSYR2( 'Lower', N-K-I+1, -ONE, A( K+I, I ), 1, WORK, 1,
   
          $               A( K+I, K+I ), LDA ) */

	i__2 = *n;
	for (jj = *k + i; jj <= i__2; ++jj) {
	    i__3 = *n;
	    for (ii = jj; ii <= i__3; ++ii) {
		i__4 = ii + jj * a_dim1;
		i__5 = ii + jj * a_dim1;
		i__6 = ii + i * a_dim1;
		i__7 = jj - *k - i + 1;
		z__3.r = a[i__6].r * work[i__7].r - a[i__6].i * work[i__7].i, 
			z__3.i = a[i__6].r * work[i__7].i + a[i__6].i * work[
			i__7].r;
		z__2.r = a[i__5].r - z__3.r, z__2.i = a[i__5].i - z__3.i;
		i__8 = ii - *k - i + 1;
		i__9 = jj + i * a_dim1;
		z__4.r = work[i__8].r * a[i__9].r - work[i__8].i * a[i__9].i, 
			z__4.i = work[i__8].r * a[i__9].i + work[i__8].i * a[
			i__9].r;
		z__1.r = z__2.r - z__4.r, z__1.i = z__2.i - z__4.i;
		a[i__4].r = z__1.r, a[i__4].i = z__1.i;
/* L70: */
	    }
/* L80: */
	}

	i__2 = *k + i + i * a_dim1;
	z__1.r = -wa.r, z__1.i = -wa.i;
	a[i__2].r = z__1.r, a[i__2].i = z__1.i;
	i__2 = *n;
	for (j = *k + i + 1; j <= i__2; ++j) {
	    i__3 = j + i * a_dim1;
	    a[i__3].r = 0., a[i__3].i = 0.;
/* L90: */
	}
/* L100: */
    }

/*     Store full symmetric matrix */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	i__2 = *n;
	for (i = j + 1; i <= i__2; ++i) {
	    i__3 = j + i * a_dim1;
	    i__4 = i + j * a_dim1;
	    a[i__3].r = a[i__4].r, a[i__3].i = a[i__4].i;
/* L110: */
	}
/* L120: */
    }
    return 0;

/*     End of ZLAGSY */

}